

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

void write_parser_tables_internal
               (Grammar *g,char *base_pathname,char *tag,int binary,FILE *fp,uint8 **str,
               uint *str_len)

{
  byte bVar1;
  Production *pPVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  FILE *pFVar10;
  size_t sVar11;
  FILE *pFVar12;
  Code *pCVar13;
  ushort **ppuVar14;
  D_Pass *pDVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  uint iproduction;
  char *end;
  long lVar19;
  Term *pTVar20;
  FILE *f;
  char *pcVar21;
  uint uVar22;
  ulong uVar23;
  char *start;
  char ver_1 [128];
  char ver [128];
  File local_11a8;
  char local_10b8 [128];
  char local_1038 [8];
  undefined4 auStack_1030 [1024];
  
  if ((binary == 0) && (fp = (FILE *)fopen(g->write_pathname,"w"), (FILE *)fp == (FILE *)0x0)) {
    fp = (FILE *)0x0;
    d_fail("unable to open `%s` for write\n");
  }
  if (*g->actions_write_pathname == '\0') {
    pFVar10 = (FILE *)0x0;
  }
  else {
    pFVar10 = fopen(g->actions_write_pathname,"w");
    if (pFVar10 == (FILE *)0x0) {
      pFVar10 = (FILE *)0x0;
      d_fail("unable to open `%s` for write\n");
    }
  }
  bVar3 = false;
  memset(&local_11a8,0,0xf0);
  local_11a8.str_len = str_len;
  local_11a8.binary = binary;
  local_11a8.fp = fp;
  local_11a8.actions_fp = (FILE *)pFVar10;
  local_11a8.str = str;
  if (binary == 0) {
    local_11a8.relocations.v = (char **)0x0;
    local_11a8.entries.v = (OffsetEntry **)0x0;
    local_11a8.str_relocations.v = (char **)0x0;
    uVar23 = (ulong)(g->terminals).n;
    if (uVar23 != 0) {
      uVar18 = 0;
      bVar3 = false;
      do {
        if ((g->terminals).v[uVar18]->kind == TERM_TOKEN) {
          bVar3 = true;
        }
        uVar18 = uVar18 + 1;
      } while (uVar23 != uVar18);
    }
    bVar4 = true;
    if (g->states_for_all_nterms == 0) {
      if ((g->productions).n == 0) {
        bVar4 = false;
      }
      else {
        bVar4 = false;
        iproduction = 0;
        do {
          uVar7 = state_for_declaration(g,iproduction);
          if (uVar7 != 0) {
            bVar4 = true;
          }
          iproduction = iproduction + 1;
        } while (iproduction < (g->productions).n);
      }
    }
    if ((0 < g->write_header) || ((bVar5 = true, g->write_header < 0 && (bVar3 || bVar4)))) {
      strcpy(local_1038,base_pathname);
      sVar11 = strlen(local_1038);
      builtin_strncpy(local_1038 + sVar11,".d_parse",8);
      *(undefined4 *)((long)auStack_1030 + sVar11) = 0x682e72;
      pFVar12 = fopen(local_1038,"w");
      if (pFVar12 == (FILE *)0x0) {
        d_fail("unable to open `%s` for write\n",local_1038);
        d_version(local_10b8);
        myfprintf((FILE *)0x0,"/*\n  Generated by Make DParser Version %s\n",local_10b8);
        myfprintf((FILE *)0x0,"  Available at https://github.com/jplevyak/dparser\n*/\n\n");
        myfprintf((FILE *)0x0,"#ifndef _%s_h\n",tag);
        f = (FILE *)0x0;
      }
      else {
        d_version(local_10b8);
        myfprintf((FILE *)pFVar12,"/*\n  Generated by Make DParser Version %s\n",local_10b8);
        myfprintf((FILE *)pFVar12,"  Available at https://github.com/jplevyak/dparser\n*/\n\n");
        myfprintf((FILE *)pFVar12,"#ifndef _%s_h\n",tag);
        f = pFVar12;
      }
      myfprintf((FILE *)f,"#define _%s_h\n",tag);
      if (bVar3) {
        if (g->token_type == 0) {
          uVar17 = (g->terminals).n;
          if (uVar17 != 0) {
            uVar23 = 0;
            do {
              pTVar20 = (g->terminals).v[uVar23];
              if (pTVar20->kind == TERM_TOKEN) {
                myfprintf((FILE *)pFVar12,"#define %s \t%d\n",pTVar20->string,
                          (ulong)((g->productions).n + pTVar20->index));
                uVar17 = (g->terminals).n;
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 < uVar17);
          }
        }
        else {
          myfprintf((FILE *)pFVar12,"enum D_Tokens_%s {\n",tag);
          uVar17 = (g->terminals).n;
          if (uVar17 != 0) {
            uVar23 = 0;
            uVar22 = 0;
            do {
              pTVar20 = (g->terminals).v[uVar23];
              if (pTVar20->kind == TERM_TOKEN) {
                uVar22 = uVar22 + pTVar20->string_len + 7;
                if (0x46 < uVar22) {
                  putchar(10);
                  pTVar20 = (g->terminals).v[uVar23];
                  uVar17 = (g->terminals).n;
                  uVar22 = 0;
                }
                pcVar21 = ", ";
                if (uVar23 == uVar17 - 1) {
                  pcVar21 = "";
                }
                myfprintf((FILE *)pFVar12,"%s = %d%s",pTVar20->string,
                          (ulong)((g->productions).n + pTVar20->index),pcVar21);
                uVar17 = (g->terminals).n;
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 < uVar17);
          }
          myfprintf((FILE *)pFVar12,"\n};\n");
        }
      }
      if ((bVar4) && (uVar17 = (g->productions).n, uVar17 != 0)) {
        uVar23 = 0;
        do {
          pPVar2 = (g->productions).v[uVar23];
          if (((pPVar2->field_0x3c & 0x1c) == 0) && (pPVar2->elem != (Elem *)0x0)) {
            myfprintf((FILE *)pFVar12,"#define D_START_STATE_%s \t%d\n",pPVar2->name,
                      (ulong)pPVar2->state->index);
            uVar17 = (g->productions).n;
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 < uVar17);
      }
      bVar5 = false;
      myfprintf((FILE *)pFVar12,"#endif\n");
      fclose(pFVar12);
    }
    d_version(local_1038);
    myfprintf(fp,"/*\n  Generated by Make DParser Version %s\n",local_1038);
    myfprintf(fp,"  Available at https://github.com/jplevyak/dparser\n*/\n\n");
    g->write_line = 7;
    pFVar12 = pFVar10;
    if (pFVar10 == (FILE *)0x0) {
      pFVar12 = (FILE *)fp;
    }
    if (g->ncode != 0) {
      uVar23 = 0;
LAB_0013958b:
      pCVar13 = g->code;
      pcVar21 = pCVar13[uVar23].code;
      if (g->write_line_directives == 0) {
        if ((FILE *)local_11a8.actions_fp == (FILE *)0x0) goto LAB_0013980d;
        pCVar13 = g->code;
      }
      else if ((FILE *)local_11a8.actions_fp == (FILE *)0x0) {
        myfprintf((FILE *)pFVar12,"#line %d \"%s\"\n",(ulong)(uint)pCVar13[uVar23].line,g->pathname)
        ;
        g->write_line = g->write_line + 1;
        goto LAB_0013980d;
      }
      uVar17 = pCVar13[uVar23].line;
      pcVar16 = g->pathname;
      iVar8 = count_newlines(pcVar21);
      myfprintf((FILE *)pFVar12,"%d \"%s\" %d\n",(ulong)uVar17,pcVar16,(ulong)(iVar8 + 1));
LAB_0013980d:
      cVar6 = *pcVar21;
      if (cVar6 == '\n') {
        g->write_line = g->write_line + 1;
        cVar6 = *pcVar21;
      }
      else if (cVar6 == '\0') goto code_r0x00139823;
      if (cVar6 == '$') {
        iVar8 = (int)uVar23;
        if (pcVar21[1] == '{') {
          pcVar16 = pcVar21 + 2;
          pcVar21 = pcVar21 + 3;
          lVar19 = 0;
          while( true ) {
            bVar1 = pcVar16[lVar19];
            if (((bVar1 == 0) || (bVar1 == 0x7d)) ||
               (ppuVar14 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar14 + (ulong)bVar1 * 2 + 1) & 0x20) != 0)) break;
            lVar19 = lVar19 + 1;
            pcVar21 = pcVar21 + 1;
          }
          ppuVar14 = __ctype_b_loc();
          uVar17 = (*ppuVar14)[bVar1] >> 0xd & 1;
          start = pcVar16 + lVar19;
          pcVar21 = pcVar21 + uVar17;
          for (end = start + uVar17; (*end != '\0' && (*end != '}')); end = end + 1) {
            pcVar21 = pcVar21 + 1;
          }
          if (lVar19 == 4) {
            iVar9 = strncasecmp(pcVar16,"pass",4);
            if (iVar9 != 0) goto LAB_0013977c;
            pDVar15 = find_pass(g,start,end);
            if (pDVar15 == (D_Pass *)0x0) {
              pcVar16 = dup_str(start,end);
              d_fail("unknown pass \'%s\' line %d",pcVar16,
                     (ulong)(uint)(g->code[uVar23].line + iVar8));
            }
            uVar17 = pDVar15->index;
LAB_00139806:
            myfprintf((FILE *)pFVar12,"%d",(ulong)uVar17);
          }
          else {
            if (lVar19 == 6) {
              iVar9 = strncasecmp(pcVar16,"string",6);
              if (iVar9 == 0) {
                iVar8 = 4;
                goto LAB_00139749;
              }
            }
            else if ((lVar19 == 5) && (iVar9 = strncasecmp(pcVar16,"nterm",5), iVar9 == 0)) {
              iVar8 = 1;
LAB_00139749:
              uVar17 = find_symbol(g,start,end,iVar8);
              goto LAB_00139806;
            }
LAB_0013977c:
            d_fail("bad $ escape in code line %u\n",(ulong)(uint)(g->code[uVar23].line + iVar8));
          }
        }
        else {
          pcVar21 = pcVar21 + 1;
          d_fail("bad $ escape in code line %u\n",(ulong)(uint)(g->code[uVar23].line + iVar8));
        }
      }
      else {
        fputc((int)cVar6,pFVar12);
        pcVar21 = pcVar21 + 1;
      }
      goto LAB_0013980d;
    }
    uVar18 = 7;
LAB_00139865:
    if ((g->write_line_directives != 0) && (pFVar10 == (FILE *)0x0)) {
      myfprintf((FILE *)pFVar12,"#line %d \"%s\"\n",uVar18,g->write_pathname);
      g->write_line = g->write_line + 1;
    }
    myfprintf(fp,"#include \"stdlib.h\"\n");
    myfprintf(fp,"#include \"dparse.h\"\n");
    g->write_line = g->write_line + 1;
    if (!bVar5) {
      myfprintf(fp,"#include \"%s.d_parser.h\"\n",base_pathname);
      g->write_line = g->write_line + 1;
    }
    myfprintf(fp,"\n");
    g->write_line = g->write_line + 1;
  }
  else {
    local_11a8.tables.len = 0x400;
    local_11a8.tables.start = (char *)calloc(1,0x400);
    local_11a8.strings.len = 0x400;
    local_11a8.tables.cur = local_11a8.tables.start;
    local_11a8.strings.start = (char *)calloc(1,0x400);
    local_11a8.relocations.n = 0;
    local_11a8.relocations.v = (char **)0x0;
    local_11a8.entries.n = 0;
    local_11a8.entries.v = (OffsetEntry **)0x0;
    local_11a8.str_relocations.n = 0;
    local_11a8.str_relocations.v = (char **)0x0;
    local_11a8.strings.cur = local_11a8.strings.start;
  }
  write_parser_tables(g,tag,&local_11a8);
  return;
code_r0x00139823:
  myfprintf((FILE *)pFVar12,"\n");
  uVar17 = g->write_line + 1;
  uVar18 = (ulong)uVar17;
  g->write_line = uVar17;
  uVar23 = uVar23 + 1;
  pFVar10 = (FILE *)local_11a8.actions_fp;
  if (g->ncode <= uVar23) goto LAB_00139865;
  goto LAB_0013958b;
}

Assistant:

void write_parser_tables_internal(Grammar *g, char *base_pathname, char *tag, int binary, FILE *fp, uint8 **str,
                                  uint *str_len) {
  File file;
  FILE *actions_fp = NULL;
  if (!binary) {
    fp = fopen(g->write_pathname, "w");
    if (!fp) d_fail("unable to open `%s` for write\n", g->write_pathname);
  }
  if (g->actions_write_pathname[0]) {
    actions_fp = fopen(g->actions_write_pathname, "w");
    if (!actions_fp) d_fail("unable to open `%s` for write\n", g->actions_write_pathname);
  }
  file_init(&file, binary, fp, actions_fp, str, str_len);
  if (!binary) {
    char ver[128];
    int header = write_header(g, base_pathname, tag);
    d_version(ver);
    fprintf(fp, "/*\n  Generated by Make DParser Version %s\n", ver);
    fprintf(fp, "  Available at https://github.com/jplevyak/dparser\n*/\n\n");
    g->write_line = 7;
    write_global_code(&file, g, tag);
    fprintf(fp, "#include \"stdlib.h\"\n");
    fprintf(fp, "#include \"dparse.h\"\n");
    g->write_line++;

    if (header) {
      fprintf(fp, "#include \"%s.d_parser.h\"\n", base_pathname);
      g->write_line++;
    }
    fprintf(fp, "\n");
    g->write_line++;
  }
  write_parser_tables(g, tag, &file);
}